

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

void __thiscall FConfigFile::SetSectionNote(FConfigFile *this,char *section,char *note)

{
  FConfigSection *pFVar1;
  int iVar2;
  BYTE *copyStr;
  
  pFVar1 = this->Sections;
  while ((pFVar1 != (FConfigSection *)0x0 &&
         (iVar2 = strcasecmp((pFVar1->SectionName).Chars,section), iVar2 != 0))) {
    pFVar1 = pFVar1->Next;
  }
  if (pFVar1 != (FConfigSection *)0x0) {
    copyStr = "";
    if (note != (char *)0x0) {
      copyStr = (BYTE *)note;
    }
    FString::operator=(&pFVar1->Note,(char *)copyStr);
    return;
  }
  return;
}

Assistant:

void FConfigFile::SetSectionNote(const char *section, const char *note)
{
	SetSectionNote(FindSection(section), note);
}